

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

double libcellml::Units::scalingFactor(UnitsPtr *units1,UnitsPtr *units2,bool checkCompatibility)

{
  bool bVar1;
  bool bVar2;
  undefined7 in_register_00000011;
  double dVar3;
  double multiplier;
  
  if (((int)CONCAT71(in_register_00000011,checkCompatibility) != 0) &&
     (bVar1 = compatible(units1,units2), !bVar1)) {
    return 0.0;
  }
  if (((units1->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
       (element_type *)0x0) &&
     ((units2->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
      (element_type *)0x0)) {
    multiplier = 0.0;
    bVar1 = updateUnitMultiplier(units1,-1,&multiplier);
    bVar2 = updateUnitMultiplier(units2,1,&multiplier);
    if ((bVar1) && (bVar2)) {
      dVar3 = pow(10.0,multiplier);
      return dVar3;
    }
  }
  return 0.0;
}

Assistant:

double Units::scalingFactor(const UnitsPtr &units1, const UnitsPtr &units2, bool checkCompatibility)
{
    if (checkCompatibility && !Units::compatible(units1, units2)) {
        return 0.0;
    }

    bool updateUnits1 = false;
    bool updateUnits2 = false;

    if ((units1 != nullptr) && (units2 != nullptr)) {
        double multiplier = 0.0;
        updateUnits1 = updateUnitMultiplier(units1, -1, multiplier);
        updateUnits2 = updateUnitMultiplier(units2, 1, multiplier);

        if (updateUnits1 && updateUnits2) {
            return std::pow(10, multiplier);
        }
    }

    return 0.0;
}